

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_parser.cpp
# Opt level: O0

Node * __thiscall
Parser::createLocalFunctionNode
          (Parser *this,Token *t,Node *optional_name,Node *parameters_list,Node *function_body)

{
  CompilationContext *ctx_;
  Token *in_RDI;
  Node *n;
  CompilationContext *__x;
  Node *in_stack_ffffffffffffffc0;
  
  ctx_ = (CompilationContext *)operator_new(0x30);
  Node::Node(in_stack_ffffffffffffffc0,ctx_,in_RDI);
  *(undefined4 *)
   &(ctx_->suppressWarnings).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = 0x27;
  __x = ctx_;
  std::vector<Node_*,_std::allocator<Node_*>_>::push_back
            ((vector<Node_*,_std::allocator<Node_*>_> *)in_stack_ffffffffffffffc0,(value_type *)ctx_
            );
  std::vector<Node_*,_std::allocator<Node_*>_>::push_back
            ((vector<Node_*,_std::allocator<Node_*>_> *)in_stack_ffffffffffffffc0,(value_type *)__x)
  ;
  std::vector<Node_*,_std::allocator<Node_*>_>::push_back
            ((vector<Node_*,_std::allocator<Node_*>_> *)in_stack_ffffffffffffffc0,(value_type *)__x)
  ;
  return (Node *)ctx_;
}

Assistant:

Node * createLocalFunctionNode(Token & t, Node * optional_name, Node * parameters_list, Node * function_body)
  {
    Node * n = new Node(ctx, t);
    n->nodeType = PNT_LOCAL_FUNCTION;
    n->children.push_back(optional_name);
    n->children.push_back(parameters_list);
    n->children.push_back(function_body);
    return n;
  }